

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O2

void FreeContent(SUNNonlinearSolver NLS)

{
  void *pvVar1;
  
  pvVar1 = NLS->content;
  if (*(N_Vector *)((long)pvVar1 + 0x68) != (N_Vector)0x0) {
    N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x68));
    pvVar1 = NLS->content;
    *(undefined8 *)((long)pvVar1 + 0x68) = 0;
  }
  if (*(N_Vector *)((long)pvVar1 + 0x70) != (N_Vector)0x0) {
    N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x70));
    pvVar1 = NLS->content;
    *(undefined8 *)((long)pvVar1 + 0x70) = 0;
  }
  if (*(N_Vector *)((long)pvVar1 + 0x78) != (N_Vector)0x0) {
    N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x78));
    pvVar1 = NLS->content;
    *(undefined8 *)((long)pvVar1 + 0x78) = 0;
  }
  if (*(N_Vector *)((long)pvVar1 + 0x80) != (N_Vector)0x0) {
    N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x80));
    pvVar1 = NLS->content;
    *(undefined8 *)((long)pvVar1 + 0x80) = 0;
  }
  if (*(N_Vector *)((long)pvVar1 + 0x88) != (N_Vector)0x0) {
    N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x88));
    pvVar1 = NLS->content;
    *(undefined8 *)((long)pvVar1 + 0x88) = 0;
  }
  if (*(void **)((long)pvVar1 + 0x18) != (void *)0x0) {
    free(*(void **)((long)pvVar1 + 0x18));
    pvVar1 = NLS->content;
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
  }
  if (*(void **)((long)pvVar1 + 0x30) != (void *)0x0) {
    free(*(void **)((long)pvVar1 + 0x30));
    pvVar1 = NLS->content;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
  }
  if (*(void **)((long)pvVar1 + 0x38) != (void *)0x0) {
    free(*(void **)((long)pvVar1 + 0x38));
    pvVar1 = NLS->content;
    *(undefined8 *)((long)pvVar1 + 0x38) = 0;
  }
  if (*(void **)((long)pvVar1 + 0x40) != (void *)0x0) {
    free(*(void **)((long)pvVar1 + 0x40));
    pvVar1 = NLS->content;
    *(undefined8 *)((long)pvVar1 + 0x40) = 0;
  }
  if (*(N_Vector **)((long)pvVar1 + 0x48) != (N_Vector *)0x0) {
    N_VDestroyVectorArray(*(N_Vector **)((long)pvVar1 + 0x48),*(int *)((long)pvVar1 + 0x10));
    pvVar1 = NLS->content;
    *(undefined8 *)((long)pvVar1 + 0x48) = 0;
  }
  if (*(N_Vector **)((long)pvVar1 + 0x50) != (N_Vector *)0x0) {
    N_VDestroyVectorArray(*(N_Vector **)((long)pvVar1 + 0x50),*(int *)((long)pvVar1 + 0x10));
    pvVar1 = NLS->content;
    *(undefined8 *)((long)pvVar1 + 0x50) = 0;
  }
  if (*(N_Vector **)((long)pvVar1 + 0x58) != (N_Vector *)0x0) {
    N_VDestroyVectorArray(*(N_Vector **)((long)pvVar1 + 0x58),*(int *)((long)pvVar1 + 0x10));
    pvVar1 = NLS->content;
    *(undefined8 *)((long)pvVar1 + 0x58) = 0;
  }
  if (*(void **)((long)pvVar1 + 0x60) != (void *)0x0) {
    free(*(void **)((long)pvVar1 + 0x60));
    *(undefined8 *)((long)NLS->content + 0x60) = 0;
  }
  return;
}

Assistant:

static void FreeContent(SUNNonlinearSolver NLS)
{
  if (FP_CONTENT(NLS)->yprev) {
    N_VDestroy(FP_CONTENT(NLS)->yprev);
    FP_CONTENT(NLS)->yprev = NULL; }

  if (FP_CONTENT(NLS)->gy) {
    N_VDestroy(FP_CONTENT(NLS)->gy);
    FP_CONTENT(NLS)->gy = NULL; }

  if (FP_CONTENT(NLS)->fold) {
    N_VDestroy(FP_CONTENT(NLS)->fold);
    FP_CONTENT(NLS)->fold = NULL; }

  if (FP_CONTENT(NLS)->gold) {
    N_VDestroy(FP_CONTENT(NLS)->gold);
    FP_CONTENT(NLS)->gold = NULL; }

  if (FP_CONTENT(NLS)->delta) {
    N_VDestroy(FP_CONTENT(NLS)->delta);
    FP_CONTENT(NLS)->delta = NULL; }

  if (FP_CONTENT(NLS)->imap) {
    free(FP_CONTENT(NLS)->imap);
    FP_CONTENT(NLS)->imap = NULL; }

  if (FP_CONTENT(NLS)->R) {
    free(FP_CONTENT(NLS)->R);
    FP_CONTENT(NLS)->R = NULL; }

  if (FP_CONTENT(NLS)->gamma) {
    free(FP_CONTENT(NLS)->gamma);
    FP_CONTENT(NLS)->gamma = NULL; }

  if (FP_CONTENT(NLS)->cvals) {
    free(FP_CONTENT(NLS)->cvals);
    FP_CONTENT(NLS)->cvals = NULL; }

  if (FP_CONTENT(NLS)->df) {
    N_VDestroyVectorArray(FP_CONTENT(NLS)->df, FP_CONTENT(NLS)->m);
    FP_CONTENT(NLS)->df = NULL; }

  if (FP_CONTENT(NLS)->dg) {
    N_VDestroyVectorArray(FP_CONTENT(NLS)->dg, FP_CONTENT(NLS)->m);
    FP_CONTENT(NLS)->dg = NULL; }

  if (FP_CONTENT(NLS)->q) {
    N_VDestroyVectorArray(FP_CONTENT(NLS)->q, FP_CONTENT(NLS)->m);
    FP_CONTENT(NLS)->q = NULL; }

  if (FP_CONTENT(NLS)->Xvecs) {
    free(FP_CONTENT(NLS)->Xvecs);
    FP_CONTENT(NLS)->Xvecs = NULL; }

  return;
}